

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::ViewportArray::ScissorTestStateAPI::iterate(ScissorTestStateAPI *this)

{
  uchar uVar1;
  GLint i_3;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  ulong uVar5;
  NotSupportedError *this_00;
  GLint i_2;
  long lVar6;
  char *description;
  GLint i;
  ulong uVar7;
  bool test_result;
  GLint max_viewports;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scissor_test_states_a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scissor_test_states_b;
  long lVar4;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    test_result = true;
    max_viewports = 0;
    (**(code **)(lVar4 + 0x868))(0x825b,&max_viewports);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x921);
    scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scissor_test_states_b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scissor_test_states_b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    scissor_test_states_b.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&scissor_test_states_a,(long)max_viewports);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&scissor_test_states_b,(long)max_viewports);
    getScissorTestStates(this,max_viewports,&scissor_test_states_a);
    for (uVar7 = 0; uVar5 = (ulong)max_viewports, (long)uVar7 < (long)uVar5; uVar7 = uVar7 + 1) {
      uVar1 = scissor_test_states_a.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      if (uVar1 == '\0') {
        (**(code **)(lVar4 + 0x618))(0xc11,uVar7 & 0xffffffff);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"Enablei",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x939);
      }
      else {
        (**(code **)(lVar4 + 0x520))(0xc11,uVar7 & 0xffffffff);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"Disablei",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x940);
      }
      scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7] = uVar1 == '\0';
      getScissorTestStates(this,max_viewports,&scissor_test_states_b);
      compareScissorTestStates
                (this,&scissor_test_states_a,&scissor_test_states_b,"1st toggle",&test_result);
    }
    for (uVar7 = 0; (long)uVar7 < (long)(int)uVar5; uVar7 = uVar7 + 1) {
      uVar1 = scissor_test_states_a.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      if (uVar1 == '\0') {
        (**(code **)(lVar4 + 0x618))(0xc11,uVar7 & 0xffffffff);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"Enablei",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x94e);
      }
      else {
        (**(code **)(lVar4 + 0x520))(0xc11,uVar7 & 0xffffffff);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"Disablei",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x955);
      }
      scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7] = uVar1 == '\0';
      getScissorTestStates(this,max_viewports,&scissor_test_states_b);
      compareScissorTestStates
                (this,&scissor_test_states_a,&scissor_test_states_b,"2nd toggle",&test_result);
      uVar5 = (ulong)(uint)max_viewports;
    }
    for (lVar6 = 0; lVar6 < (int)uVar5; lVar6 = lVar6 + 1) {
      scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar6] = '\x01';
      uVar5 = (ulong)(uint)max_viewports;
    }
    (**(code **)(lVar4 + 0x5e0))(0xc11);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Enable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x968);
    getScissorTestStates(this,max_viewports,&scissor_test_states_b);
    compareScissorTestStates
              (this,&scissor_test_states_a,&scissor_test_states_b,"1st enable all",&test_result);
    for (lVar6 = 0; lVar6 < max_viewports; lVar6 = lVar6 + 1) {
      scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar6] = '\0';
    }
    (**(code **)(lVar4 + 0x4e8))(0xc11);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Disable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x977);
    getScissorTestStates(this,max_viewports,&scissor_test_states_b);
    compareScissorTestStates
              (this,&scissor_test_states_a,&scissor_test_states_b,"Disable all",&test_result);
    for (lVar6 = 0; lVar6 < max_viewports; lVar6 = lVar6 + 1) {
      scissor_test_states_a.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar6] = '\x01';
    }
    (**(code **)(lVar4 + 0x5e0))(0xc11);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Enable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x986);
    getScissorTestStates(this,max_viewports,&scissor_test_states_b);
    compareScissorTestStates
              (this,&scissor_test_states_a,&scissor_test_states_b,"2nd enable all",&test_result);
    description = "Fail";
    if (test_result != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              (((this->super_TestCaseBase).m_context)->m_testCtx,test_result ^ QP_TEST_RESULT_FAIL,
               description);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&scissor_test_states_b.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&scissor_test_states_a.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x915);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ScissorTestStateAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLboolean> scissor_test_states_a;
	std::vector<GLboolean> scissor_test_states_b;

	scissor_test_states_a.resize(max_viewports);
	scissor_test_states_b.resize(max_viewports);

	/*
	 *   - get initial state of SCISSOR_TEST for all MAX_VIEWPORTS indices;
	 *   - for each index:
	 *     * toggle SCISSOR_TEST,
	 *     * get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 *   - for each index:
	 *     * toggle SCISSOR_TEST,
	 *     * get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	getScissorTestStates(max_viewports, scissor_test_states_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		if (GL_FALSE == scissor_test_states_a[i])
		{
			gl.enablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enablei");

			scissor_test_states_a[i] = GL_TRUE;
		}
		else
		{
			gl.disablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Disablei");

			scissor_test_states_a[i] = GL_FALSE;
		}

		getScissorTestStates(max_viewports, scissor_test_states_b);
		compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "1st toggle", test_result);
	}

	for (GLint i = 0; i < max_viewports; ++i)
	{
		if (GL_FALSE == scissor_test_states_a[i])
		{
			gl.enablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enablei");

			scissor_test_states_a[i] = GL_TRUE;
		}
		else
		{
			gl.disablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Disablei");

			scissor_test_states_a[i] = GL_FALSE;
		}

		getScissorTestStates(max_viewports, scissor_test_states_b);
		compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "2nd toggle", test_result);
	}

	/*
	 *   - enable SCISSOR_TEST for all indices at once with Enable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_TRUE;
	}

	gl.enable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "1st enable all", test_result);

	/*
	 *   - disable SCISSOR_TEST for all indices at once with Disable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_FALSE;
	}

	gl.disable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "Disable all", test_result);

	/*
	 *   - enable SCISSOR_TEST for all indices at once with Enable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_TRUE;
	}

	gl.enable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "2nd enable all", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}